

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
OneWireSimulationDataGenerator::SimWriteByte(OneWireSimulationDataGenerator *this,U32 byte)

{
  U32 mask;
  uint uVar1;
  int iVar2;
  bool bVar3;
  
  uVar1 = 1;
  iVar2 = 8;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    SimWriteBit(this,(uint)((uVar1 & byte) != 0));
    uVar1 = uVar1 * 2;
  }
  SimulationChannelDescriptor::Advance((int)this + 0x18);
  return;
}

Assistant:

void OneWireSimulationDataGenerator::SimWriteByte( U32 byte )
{
    // LSB first
    U32 mask = 1;
    for( U32 i = 0; i < 8; i++ )
    {
        U32 mask_result = byte & mask;
        if( mask_result != 0 )
            SimWriteBit( BIT_HIGH );
        else
            SimWriteBit( BIT_LOW );
        mask = mask << 1;
    }
    if( mSimOverdrive == true )
        // mSimulationSampleIndex += UsToSamples( 12 );
        mOneWireSimulationData.Advance( U32( UsToSamples( 12 ) ) );
    else
        // mSimulationSampleIndex += UsToSamples(120 );
        mOneWireSimulationData.Advance( U32( UsToSamples( 120 ) ) );
}